

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_short lhs,
         SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  short sVar2;
  short in_SI;
  unsigned_short in_DI;
  unsigned_short unaff_retaddr;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> unaff_retaddr_00;
  unsigned_short ret;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  unsigned_short *in_stack_ffffffffffffffe8;
  ushort in_stack_fffffffffffffff0;
  undefined2 uVar3;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar4;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffff8;
  short in_stack_fffffffffffffffe;
  
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffff8);
  SVar4.m_int = in_SI;
  bVar1 = DivisionCornerCaseHelper<short,_unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1
                    (unaff_retaddr,unaff_retaddr_00,
                     (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     CONCAT26(in_stack_fffffffffffffffe,
                              CONCAT24(in_SI,CONCAT22(in_DI,in_stack_fffffffffffffff8.m_int))));
  if ((!bVar1) &&
     (bVar1 = DivisionCornerCaseHelper2<short,_unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
              ::DivisionCornerCase2
                        (in_DI,SVar4,
                         (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                         &stack0xfffffffffffffff8), !bVar1)) {
    uVar3 = 0;
    sVar2 = SafeInt::operator_cast_to_short
                      ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       CONCAT26(in_SI,CONCAT24(SVar4.m_int,(uint)in_stack_fffffffffffffff0)));
    DivisionHelper<unsigned_short,_short,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((unsigned_short *)CONCAT26(in_SI,CONCAT24(SVar4.m_int,CONCAT22(uVar3,sVar2))),
               (short *)in_stack_ffffffffffffffe8,(unsigned_short *)0x18794e);
    SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_short>
              ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT26(in_SI,CONCAT24(SVar4.m_int,CONCAT22(uVar3,sVar2))),in_stack_ffffffffffffffe8
              );
    in_stack_fffffffffffffff8.m_int = in_stack_fffffffffffffffe;
  }
  return (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         in_stack_fffffffffffffff8.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}